

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

int bsd_set_nonblocking(int fd)

{
  uint uVar1;
  int in_EDI;
  
  uVar1 = fcntl(in_EDI,3,0);
  fcntl(in_EDI,4,(ulong)(uVar1 | 0x800));
  return in_EDI;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR bsd_set_nonblocking(LIBUS_SOCKET_DESCRIPTOR fd) {
#ifdef _WIN32
    /* Libuv will set windows sockets as non-blocking */
#else
    fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) | O_NONBLOCK);
#endif
    return fd;
}